

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O0

void x25519_ge_scalarmult_small_precomp(ge_p3 *h,uint8_t *a,uint8_t *precomp_table)

{
  uint8_t *s;
  crypto_word_t cVar1;
  ulong uVar2;
  undefined1 local_950 [8];
  ge_p1p1 r;
  ge_cached cached;
  ge_precomp e;
  uint8_t bit;
  char index;
  uint j;
  ge_precomp *out;
  fe y;
  fe x;
  uint8_t *bytes;
  undefined1 local_728 [4];
  uint i;
  ge_precomp multiples [15];
  uint8_t *precomp_table_local;
  uint8_t *a_local;
  ge_p3 *h_local;
  
  multiples[0xe].xy2d.v[4] = (uint64_t)precomp_table;
  for (bytes._4_4_ = 0; bytes._4_4_ < 0xf; bytes._4_4_ = bytes._4_4_ + 1) {
    s = (uint8_t *)(multiples[0xe].xy2d.v[4] + (bytes._4_4_ << 6));
    fe_frombytes_strict((fe *)(y.v + 4),s);
    fe_frombytes_strict((fe *)&out,s + 0x20);
    uVar2 = (ulong)bytes._4_4_;
    fe_add((fe_loose *)(local_728 + uVar2 * 0x78),(fe *)&out,(fe *)(y.v + 4));
    fe_sub((fe_loose *)(multiples[uVar2].yplusx.v + 4),(fe *)&out,(fe *)(y.v + 4));
    fe_mul_ltt((fe_loose *)(multiples[uVar2].yminusx.v + 4),(fe *)(y.v + 4),(fe *)&out);
    fe_mul_llt((fe_loose *)(multiples[uVar2].yminusx.v + 4),
               (fe_loose *)(multiples[uVar2].yminusx.v + 4),&d2);
  }
  ge_p3_0(h);
  for (bytes._4_4_ = 0x3f; bytes._4_4_ < 0x40; bytes._4_4_ = bytes._4_4_ - 1) {
    e.xy2d.v[4]._3_1_ = 0;
    for (e.xy2d.v[4]._4_4_ = 0; e.xy2d.v[4]._4_4_ < 4; e.xy2d.v[4]._4_4_ = e.xy2d.v[4]._4_4_ + 1) {
      e.xy2d.v[4]._3_1_ =
           e.xy2d.v[4]._3_1_ |
           ((byte)((int)(uint)a[e.xy2d.v[4]._4_4_ * 8 + (bytes._4_4_ >> 3)] >>
                  ((byte)bytes._4_4_ & 7)) & 1) << ((byte)e.xy2d.v[4]._4_4_ & 0x1f);
    }
    ge_precomp_0((ge_precomp *)(cached.T2d.v + 4));
    for (e.xy2d.v[4]._4_4_ = 1; e.xy2d.v[4]._4_4_ < 0x10; e.xy2d.v[4]._4_4_ = e.xy2d.v[4]._4_4_ + 1)
    {
      cVar1 = constant_time_eq_w((long)(char)e.xy2d.v[4]._3_1_,(ulong)e.xy2d.v[4]._4_4_);
      cmov((ge_precomp *)(cached.T2d.v + 4),
           (ge_precomp *)(local_728 + (ulong)(e.xy2d.v[4]._4_4_ - 1) * 0x78),(byte)cVar1 & 1);
    }
    x25519_ge_p3_to_cached((ge_cached *)(r.T.v + 4),h);
    x25519_ge_add((ge_p1p1 *)local_950,h,(ge_cached *)(r.T.v + 4));
    x25519_ge_p1p1_to_p3(h,(ge_p1p1 *)local_950);
    ge_madd((ge_p1p1 *)local_950,h,(ge_precomp *)(cached.T2d.v + 4));
    x25519_ge_p1p1_to_p3(h,(ge_p1p1 *)local_950);
  }
  return;
}

Assistant:

void x25519_ge_scalarmult_small_precomp(
    ge_p3 *h, const uint8_t a[32], const uint8_t precomp_table[15 * 2 * 32]) {
  // precomp_table is first expanded into matching |ge_precomp|
  // elements.
  ge_precomp multiples[15];

  unsigned i;
  for (i = 0; i < 15; i++) {
    // The precomputed table is assumed to already clear the top bit, so
    // |fe_frombytes_strict| may be used directly.
    const uint8_t *bytes = &precomp_table[i * (2 * 32)];
    fe x, y;
    fe_frombytes_strict(&x, bytes);
    fe_frombytes_strict(&y, bytes + 32);

    ge_precomp *out = &multiples[i];
    fe_add(&out->yplusx, &y, &x);
    fe_sub(&out->yminusx, &y, &x);
    fe_mul_ltt(&out->xy2d, &x, &y);
    fe_mul_llt(&out->xy2d, &out->xy2d, &d2);
  }

  // See the comment above |k25519SmallPrecomp| about the structure of the
  // precomputed elements. This loop does 64 additions and 64 doublings to
  // calculate the result.
  ge_p3_0(h);

  for (i = 63; i < 64; i--) {
    unsigned j;
    signed char index = 0;

    for (j = 0; j < 4; j++) {
      const uint8_t bit = 1 & (a[(8 * j) + (i / 8)] >> (i & 7));
      index |= (bit << j);
    }

    ge_precomp e;
    ge_precomp_0(&e);

    for (j = 1; j < 16; j++) {
      cmov(&e, &multiples[j - 1], 1 & constant_time_eq_w(index, j));
    }

    ge_cached cached;
    ge_p1p1 r;
    x25519_ge_p3_to_cached(&cached, h);
    x25519_ge_add(&r, h, &cached);
    x25519_ge_p1p1_to_p3(h, &r);

    ge_madd(&r, h, &e);
    x25519_ge_p1p1_to_p3(h, &r);
  }
}